

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidylib.c
# Opt level: O2

int tidySaveBuffer(TidyDoc tdoc,TidyBuffer *outbuf)

{
  int iVar1;
  StreamOut *out;
  TidyDocImpl *doc;
  
  if (outbuf != (TidyBuffer *)0x0) {
    out = prvTidyBufferOutput((TidyDocImpl *)tdoc,outbuf,tdoc[0x94]._opaque,tdoc[0x8e]._opaque);
    iVar1 = tidyDocSaveStream((TidyDocImpl *)tdoc,out);
    (**(code **)(**(long **)(tdoc + 0xd18) + 0x10))(*(long **)(tdoc + 0xd18),out);
    return iVar1;
  }
  return -0x16;
}

Assistant:

int         tidyDocSaveBuffer( TidyDocImpl* doc, TidyBuffer* outbuf )
{
    int status = -EINVAL;
    if ( outbuf )
    {
        uint outenc = cfg( doc, TidyOutCharEncoding );
        uint nl = cfg( doc, TidyNewline );
        StreamOut* out = TY_(BufferOutput)( doc, outbuf, outenc, nl );

        status = tidyDocSaveStream( doc, out );
        TidyDocFree( doc, out );
    }
    return status;
}